

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

bool __thiscall wasm::anon_unknown_0::SubTyper::isSubType(SubTyper *this,Field *a,Field *b)

{
  Type a_00;
  bool bVar1;
  
  a_00.id = (a->type).id;
  if (((*(SubTyper **)this != (SubTyper *)a_00.id) || (*(PackedType *)(this + 8) != a->packedType))
     || (bVar1 = true, *(Mutability *)(this + 0xc) != a->mutable_)) {
    if ((a->mutable_ == Immutable && *(int *)(this + 0xc) == 0) &&
       (*(PackedType *)(this + 8) == a->packedType)) {
      bVar1 = isSubType(*(SubTyper **)this,a_00,(Type)a);
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SubTyper::isSubType(const Field& a, const Field& b) {
  if (a == b) {
    return true;
  }
  // Immutable fields can be subtypes.
  return a.mutable_ == Immutable && b.mutable_ == Immutable &&
         a.packedType == b.packedType && isSubType(a.type, b.type);
}